

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_EnumerateLf(int nVars,int nNodeMax,int fDelay,int fMulti,int fVerbose,char *pFileName)

{
  int FanJ;
  Vec_Wec_t *pVVar1;
  Vec_Int_t *vFuns;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Dtt_Man_t *p;
  Vec_Int_t *pVVar7;
  uint uVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  uint Truth;
  word nMultis;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint Truth_00;
  long lVar17;
  long lVar18;
  ulong uVar19;
  timespec ts;
  word local_b0;
  abctime local_a8;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_a8 = -1;
  }
  else {
    local_a8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p = Dtt_ManAlloc(nVars,fMulti);
  pVVar7 = p->vFanins;
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(p->vTruths,0);
  Vec_IntPush(p->vConfigs,0);
  pVVar7 = p->vTruthNpns;
  Vec_IntPush(p->vClasses,pVVar7->nSize);
  Vec_IntPush(pVVar7,0);
  *p->pPres = *p->pPres | 1;
  pVVar1 = p->vFunNodes;
  iVar2 = p->vFanins->nSize;
  if (pVVar1->nSize < 1) {
    iVar12 = pVVar1->nCap;
    if (iVar12 < 1) {
      if (pVVar1->pArray == (Vec_Int_t *)0x0) {
        pVVar7 = (Vec_Int_t *)malloc(0x10);
      }
      else {
        pVVar7 = (Vec_Int_t *)realloc(pVVar1->pArray,0x10);
        iVar12 = pVVar1->nCap;
      }
      pVVar1->pArray = pVVar7;
      memset(pVVar7 + iVar12,0,(long)(1 - iVar12) << 4);
      pVVar1->nCap = 1;
    }
    pVVar1->nSize = 1;
  }
  Vec_IntPush(pVVar1->pArray,iVar2 / 2);
  pVVar7 = p->vFanins;
  lVar18 = 0;
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(p->vTruths,-0x55555556);
  Vec_IntPush(p->vConfigs,0);
  pVVar7 = p->vTruthNpns;
  Vec_IntPush(p->vClasses,pVVar7->nSize);
  Vec_IntPush(pVVar7,-0x55555556);
  if (0 < nVars) {
    uVar3 = p->CmpMask;
    pwVar9 = p->pPres;
    uVar4 = p->FunMask;
    do {
      uVar8 = (-(uint)((uVar3 & *(uint *)((long)s_Truths6 + lVar18)) != 0) ^
              *(uint *)((long)s_Truths6 + lVar18)) & uVar4;
      pwVar9[(int)uVar8 >> 6] = pwVar9[(int)uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
      lVar18 = lVar18 + 8;
    } while ((ulong)(uint)nVars << 3 != lVar18);
  }
  p->Counts[0] = 2;
  local_b0 = 0;
  Dtt_PrintStats(0,nVars,p->vFunNodes,0,local_a8,fDelay,0);
  if (0 < nNodeMax) {
    uVar16 = 1;
    nMultis = 0;
    do {
      iVar2 = (int)uVar16;
      uVar3 = iVar2 - 1;
      uVar19 = 0;
      do {
        if ((long)uVar19 <= (long)(int)uVar3) {
          uVar4 = p->vFunNodes->nSize;
          if (((long)(int)uVar4 <= (long)uVar19) || (uVar4 <= uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar7 = p->vFunNodes->pArray;
          if (0 < pVVar7[uVar19].nSize) {
            uVar11 = (ulong)uVar3;
            lVar18 = 0;
            do {
              iVar12 = pVVar7[uVar19].pArray[lVar18];
              if (((long)iVar12 < 0) || (p->vTruths->nSize <= iVar12)) {
LAB_00526faf:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              vFuns = p->vTemp;
              Dtt_ManCollect(p,p->vTruths->pArray[iVar12],vFuns);
              uVar4 = 0;
              if (uVar19 == uVar11) {
                uVar4 = (uint)lVar18;
              }
              if ((int)uVar4 < pVVar7[uVar11].nSize) {
                uVar10 = (ulong)uVar4;
                do {
                  FanJ = pVVar7[uVar11].pArray[uVar10];
                  if (((long)FanJ < 0) || (p->vTruths->nSize <= FanJ)) goto LAB_00526faf;
                  if (0 < vFuns->nSize) {
                    uVar4 = p->vTruths->pArray[FanJ];
                    lVar17 = 0;
                    do {
                      uVar8 = vFuns->pArray[lVar17];
                      Truth = uVar8 & uVar4;
                      uVar5 = p->CmpMask;
                      pwVar9 = p->pPres;
                      uVar6 = p->FunMask;
                      uVar13 = (-(uint)((uVar5 & Truth) != 0) ^ Truth) & uVar6;
                      if ((pwVar9[(int)uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
LAB_00526af7:
                        Dtt_ManAddFunction(p,iVar2,iVar12,FanJ,0,Truth);
                        uVar5 = p->CmpMask;
                        pwVar9 = p->pPres;
                        uVar6 = p->FunMask;
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar13 = p->pTable[uVar13];
                        if ((uint)p->nClasses <= uVar13) goto LAB_00526f45;
                        if ((long)uVar16 <= (long)p->pNodes[uVar13]) {
                          if (uVar16 != (uint)p->pNodes[uVar13]) goto LAB_00526f64;
                          if (p->pVisited[uVar13] == '\0') goto LAB_00526af7;
                        }
                      }
                      uVar13 = ~uVar8 & uVar4;
                      uVar14 = (-(uint)((uVar5 & uVar13) != 0) ^ uVar13) & uVar6;
                      if ((pwVar9[(int)uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
LAB_00526b9e:
                        Dtt_ManAddFunction(p,iVar2,iVar12,FanJ,1,uVar13);
                        uVar5 = p->CmpMask;
                        pwVar9 = p->pPres;
                        uVar6 = p->FunMask;
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar14 = p->pTable[uVar14];
                        if ((uint)p->nClasses <= uVar14) goto LAB_00526f45;
                        if ((long)uVar16 <= (long)p->pNodes[uVar14]) {
                          if (uVar16 != (uint)p->pNodes[uVar14]) goto LAB_00526f64;
                          if (p->pVisited[uVar14] == '\0') goto LAB_00526b9e;
                        }
                      }
                      Truth_00 = uVar8 & ~uVar4;
                      uVar14 = (-(uint)((uVar5 & Truth_00) != 0) ^ Truth_00) & uVar6;
                      if ((pwVar9[(int)uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
LAB_00526c4d:
                        Dtt_ManAddFunction(p,iVar2,iVar12,FanJ,2,Truth_00);
                        uVar5 = p->CmpMask;
                        pwVar9 = p->pPres;
                        uVar6 = p->FunMask;
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar14 = p->pTable[uVar14];
                        if ((uint)p->nClasses <= uVar14) goto LAB_00526f45;
                        if ((long)uVar16 <= (long)p->pNodes[uVar14]) {
                          if (uVar16 != (uint)p->pNodes[uVar14]) goto LAB_00526f64;
                          if (p->pVisited[uVar14] == '\0') goto LAB_00526c4d;
                        }
                      }
                      uVar14 = uVar8 | uVar4;
                      uVar15 = (-(uint)((uVar5 & uVar14) != 0) ^ uVar14) & uVar6;
                      if ((pwVar9[(int)uVar15 >> 6] >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
LAB_00526cf1:
                        Dtt_ManAddFunction(p,iVar2,iVar12,FanJ,3,uVar14);
                        uVar5 = p->CmpMask;
                        pwVar9 = p->pPres;
                        uVar6 = p->FunMask;
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar15 = p->pTable[uVar15];
                        if ((uint)p->nClasses <= uVar15) goto LAB_00526f45;
                        if ((long)uVar16 <= (long)p->pNodes[uVar15]) {
                          if (uVar16 != (uint)p->pNodes[uVar15]) goto LAB_00526f64;
                          if (p->pVisited[uVar15] == '\0') goto LAB_00526cf1;
                        }
                      }
                      uVar8 = uVar8 ^ uVar4;
                      uVar6 = (-(uint)((uVar5 & uVar8) != 0) ^ uVar8) & uVar6;
                      if ((pwVar9[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_00526d9f:
                        Dtt_ManAddFunction(p,iVar2,iVar12,FanJ,4,uVar8);
                        if (p->pTable != (uint *)0x0) {
LAB_00526dd5:
                          Dtt_ManAddVisited(p,Truth,iVar2);
                          if ((((p->pTable != (uint *)0x0) &&
                               (Dtt_ManAddVisited(p,uVar13,iVar2), p->pTable != (uint *)0x0)) &&
                              (Dtt_ManAddVisited(p,Truth_00,iVar2), p->pTable != (uint *)0x0)) &&
                             (Dtt_ManAddVisited(p,uVar14,iVar2), p->pTable != (uint *)0x0)) {
                            Dtt_ManAddVisited(p,uVar8,iVar2);
                          }
                        }
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar5 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar5) {
LAB_00526f45:
                          __assert_fail("Class < (unsigned)p->nClasses",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                                        ,0x219,"int Dtt_ManGetFun(Dtt_Man_t *, unsigned int, int)");
                        }
                        if ((long)uVar16 <= (long)p->pNodes[uVar5]) {
                          if (uVar16 != (uint)p->pNodes[uVar5]) {
LAB_00526f64:
                            __assert_fail("p->pNodes[Class] == n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                                          ,0x21c,"int Dtt_ManGetFun(Dtt_Man_t *, unsigned int, int)"
                                         );
                          }
                          if (p->pVisited[uVar5] == '\0') goto LAB_00526d9f;
                        }
                        goto LAB_00526dd5;
                      }
                      local_b0 = local_b0 + 5;
                      lVar17 = lVar17 + 1;
                    } while (lVar17 < vFuns->nSize);
                  }
                  if (p->pTable != (uint *)0x0) {
                    Dtt_ManProcessVisited(p);
                  }
                  nMultis = nMultis + 1;
                  uVar10 = uVar10 + 1;
                } while ((int)uVar10 < pVVar7[uVar11].nSize);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < pVVar7[uVar19].nSize);
          }
        }
        uVar19 = uVar19 + 1;
        uVar3 = uVar3 + fDelay + -1;
      } while (uVar19 != uVar16);
      iVar2 = Dtt_PrintStats(iVar2,nVars,p->vFunNodes,local_b0,local_a8,fDelay,nMultis);
    } while ((iVar2 != 0) && (uVar16 = uVar16 + 1, uVar16 != nNodeMax + 1));
  }
  if (fDelay == 0) {
    if (pFileName != (char *)0x0) {
      Dtt_DumpLibrary(p,pFileName);
    }
  }
  else {
    Dtt_PrintDistrib(p);
  }
  Dtt_ManFree(p);
  return;
}

Assistant:

void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName )
{
    abctime clk = Abc_Clock(); word nSteps = 0, nMultis = 0;
    Dtt_Man_t * p = Dtt_ManAlloc( nVars, fMulti ); int n, i, j;

    // constant zero class
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, 0 );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, 0 );
    Dtt_ManSetFun( p, 0 );
    // buffer class
    Vec_WecPush( p->vFunNodes, 0, Vec_IntSize(p->vFanins)/2 );
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, (unsigned)s_Truths6[0] );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, (unsigned)s_Truths6[0] );
    for ( i = 0; i < nVars; i++ )
        Dtt_ManSetFun( p, (unsigned)s_Truths6[i] );
    p->Counts[0] = 2;
    // enumerate
    Dtt_PrintStats(0, nVars, p->vFunNodes, nSteps, clk, fDelay, 0);
    for ( n = 1; n <= nNodeMax; n++ )
    {
        for ( i = 0, j = n - 1; i < n; i++, j = j - 1 + fDelay ) if ( i <= j )
        {
            Vec_Int_t * vFaninI = Vec_WecEntry( p->vFunNodes, i );
            Vec_Int_t * vFaninJ = Vec_WecEntry( p->vFunNodes, j );
            int k, i0, j0, EntryI, EntryJ;
            Vec_IntForEachEntry( vFaninI, EntryI, i0 )
            {
                unsigned TruthI = Vec_IntEntry(p->vTruths, EntryI);
                Vec_Int_t * vFuns = Dtt_ManCollect( p, TruthI, p->vTemp );
                int Start = i == j ? i0 : 0;
                Vec_IntForEachEntryStart( vFaninJ, EntryJ, j0, Start )
                {
                    unsigned Truth, TruthJ = Vec_IntEntry(p->vTruths, EntryJ);
                    Vec_IntForEachEntry( vFuns, Truth, k )
                    {
                        if ( !Dtt_ManGetFun(p,  TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 0,  TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ & ~Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 1,  TruthJ & ~Truth );
                        if ( !Dtt_ManGetFun(p, ~TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 2, ~TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ |  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 3,  TruthJ |  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ ^  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 4,  TruthJ ^  Truth );
                        nSteps += 5;

                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ & ~Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p, ~TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ |  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ ^  Truth, n );
                    }
                    nMultis++;
                    if ( p->pTable ) Dtt_ManProcessVisited( p );
                }
            }
        }
        if ( Dtt_PrintStats(n, nVars, p->vFunNodes, nSteps, clk, fDelay, nMultis) == 0 )
            break;
    }
    if ( fDelay )
        Dtt_PrintDistrib( p );
    //if ( p->pTable ) 
        //Dtt_PrintMulti( p );
    if ( !fDelay && pFileName!=NULL )
        Dtt_DumpLibrary( p, pFileName );
    Dtt_ManFree( p );
}